

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_storage.hpp
# Opt level: O1

void __thiscall
inja::FunctionStorage::add_callback
          (FunctionStorage *this,string_view name,int num_args,CallbackFunction *callback)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CallbackFunction *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_80;
  FunctionData local_58;
  
  local_a0 = &local_90;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,name._M_str,name._M_str + name._M_len);
  paVar1 = &local_80.first.field_2;
  if (local_a0 == &local_90) {
    local_80.first.field_2._8_8_ = local_90._8_8_;
    local_80.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_80.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_80.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_80.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  this_00 = &local_58.callback;
  local_58.operation = Callback;
  local_a0 = &local_90;
  local_80.second = num_args;
  std::
  function<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(std::vector<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_&)>
  ::function(this_00,callback);
  ::std::
  _Rb_tree<std::pair<std::__cxx11::string,int>,std::pair<std::pair<std::__cxx11::string,int>const,inja::FunctionStorage::FunctionData>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,int>const,inja::FunctionStorage::FunctionData>>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,inja::FunctionStorage::FunctionData>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,int>,inja::FunctionStorage::FunctionData>
            ((_Rb_tree<std::pair<std::__cxx11::string,int>,std::pair<std::pair<std::__cxx11::string,int>const,inja::FunctionStorage::FunctionData>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,int>const,inja::FunctionStorage::FunctionData>>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,inja::FunctionStorage::FunctionData>>>
              *)&this->function_storage,&local_80,&local_58);
  if (local_58.callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.callback.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.first._M_dataplus._M_p,local_80.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  return;
}

Assistant:

void add_callback(std::string_view name, int num_args, const CallbackFunction& callback) {
    function_storage.emplace(std::make_pair(static_cast<std::string>(name), num_args), FunctionData {Operation::Callback, callback});
  }